

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_saver_exit_example.cpp
# Opt level: O1

void foo3(int *a)

{
  int iVar1;
  long *plVar2;
  
  iVar1 = *a;
  *a = 3;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"foo3 a = ",9);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,*a);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  *a = iVar1;
  return;
}

Assistant:

void foo3(int& a) {
#if defined(__cpp_deduction_guides) && __cpp_deduction_guides >= 201611L
  nstd::saver_exit state_saver{a}; // Custom state saver on exit, without macros.
#else
  nstd::saver_exit<decltype(a)> state_saver{a}; // Custom state saver on exit, without macros.
#endif
  a = 3;
  std::cout << "foo3 a = " << a << std::endl;
  // Original state will automatically restored, on scope leave.
}